

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

Vec_Int_t * Emb_ManConnectedComponents(Emb_Man_t *p)

{
  int iVar1;
  uint hHandle;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *vNext_00;
  Emb_Obj_t *pObj_00;
  bool bVar2;
  int local_3c;
  int i;
  Emb_Obj_t *pThis;
  Vec_Int_t *vResult;
  Vec_Int_t *vNext;
  Vec_Int_t *vThis;
  Gia_Obj_t *pObj;
  Emb_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  p_01 = Vec_IntAlloc(1000);
  vNext_00 = Vec_IntAlloc(1000);
  p->nReached = 0;
  Emb_ManIncrementTravId(p);
  local_3c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->pGia->vCos);
    bVar2 = false;
    if (local_3c < iVar1) {
      vThis = (Vec_Int_t *)Gia_ManCo(p->pGia,local_3c);
      bVar2 = vThis != (Vec_Int_t *)0x0;
    }
    if (!bVar2) break;
    hHandle = Gia_ObjValue((Gia_Obj_t *)vThis);
    pObj_00 = Emb_ManObj(p,hHandle);
    iVar1 = Emb_ObjIsTravIdCurrent(p,pObj_00);
    if (iVar1 == 0) {
      Emb_ObjSetTravIdCurrent(p,pObj_00);
      Vec_IntPush(p_00,pObj_00->hHandle);
      Vec_IntClear(p_01);
      Vec_IntPush(p_01,pObj_00->hHandle);
      Emb_ManPerformBfs(p,p_01,vNext_00,(Emb_Dat_t *)0x0);
    }
    local_3c = local_3c + 1;
  }
  Vec_IntFree(p_01);
  Vec_IntFree(vNext_00);
  return p_00;
}

Assistant:

Vec_Int_t * Emb_ManConnectedComponents( Emb_Man_t * p )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vThis, * vNext, * vResult;
    Emb_Obj_t * pThis;
    int i;
    vResult = Vec_IntAlloc( 1000 );
    vThis   = Vec_IntAlloc( 1000 );
    vNext   = Vec_IntAlloc( 1000 );
    p->nReached = 0;
    Emb_ManIncrementTravId( p );
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        pThis = Emb_ManObj( p, Gia_ObjValue(pObj) );
        if ( Emb_ObjIsTravIdCurrent(p, pThis) )
            continue;
        Emb_ObjSetTravIdCurrent( p, pThis );
        Vec_IntPush( vResult, pThis->hHandle );
        // perform BFS from this node
        Vec_IntClear( vThis );
        Vec_IntPush( vThis, pThis->hHandle );
        Emb_ManPerformBfs( p, vThis, vNext, NULL ); 
    }
    Vec_IntFree( vThis );
    Vec_IntFree( vNext );
    return vResult;
}